

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_fbs.cpp
# Opt level: O2

vector<unsigned_short,_std::allocator<unsigned_short>_> *
flatbuffers::anon_unknown_0::ExtractProtobufIds
          (vector<unsigned_short,_std::allocator<unsigned_short>_> *__return_storage_ptr__,
          vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *fields)

{
  pointer ppFVar1;
  bool bVar2;
  int iVar3;
  Value *pVVar4;
  pointer ppFVar5;
  voffset_t proto_id;
  unsigned_short local_2c;
  allocator<char> local_29;
  
  if ((anonymous_namespace)::
      ExtractProtobufIds(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
      ::ID_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 ExtractProtobufIds(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
                                 ::ID_abi_cxx11_);
    if (iVar3 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &(anonymous_namespace)::
                  ExtractProtobufIds(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
                  ::ID_abi_cxx11_,"id",&local_29);
      __cxa_atexit(std::__cxx11::string::~string,
                   &(anonymous_namespace)::
                    ExtractProtobufIds(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
                    ::ID_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           ExtractProtobufIds(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
                           ::ID_abi_cxx11_);
    }
  }
  (__return_storage_ptr__->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppFVar1 = (fields->
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar5 = (fields->
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppFVar5 != ppFVar1;
      ppFVar5 = ppFVar5 + 1) {
    pVVar4 = SymbolTable<flatbuffers::Value>::Lookup
                       (&((*ppFVar5)->super_Definition).attributes,
                        &(anonymous_namespace)::
                         ExtractProtobufIds(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
                         ::ID_abi_cxx11_);
    if ((pVVar4 != (Value *)0x0) && ((pVVar4->constant)._M_string_length != 0)) {
      local_2c = 0;
      bVar2 = StringToNumber<unsigned_short>((pVVar4->constant)._M_dataplus._M_p,&local_2c);
      if (bVar2) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                  (__return_storage_ptr__,&local_2c);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<voffset_t> ExtractProtobufIds(
    const std::vector<FieldDef *> &fields) {
  static const std::string ID = "id";
  std::vector<voffset_t> used_proto_ids;
  for (const auto *field : fields) {
    const auto *id_attribute = field->attributes.Lookup(ID);
    if (id_attribute != nullptr && !id_attribute->constant.empty()) {
      voffset_t proto_id = 0;
      bool done = StringToNumber(id_attribute->constant.c_str(), &proto_id);
      if (done) { used_proto_ids.push_back(proto_id); }
    }
  }

  return used_proto_ids;
}